

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O0

void __thiscall server::ctfservmode::setupholdspawns(ctfservmode *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  flag *pfVar4;
  flag *f;
  uint local_14;
  ctfservmode *pcStack_10;
  int i;
  ctfservmode *this_local;
  
  if ((((-4 < gamemode) && (gamemode < 0x17)) && ((gamemodes[gamemode + 3].flags & 0x500U) == 0x500)
      ) && (pcStack_10 = this,
           bVar1 = vector<server::ctfservmode::holdspawn>::empty(&this->holdspawns), !bVar1)) {
    while (iVar2 = vector<server::ctfservmode::flag>::length(&this->flags), iVar2 < 1) {
      uVar3 = vector<server::ctfservmode::flag>::length(&this->flags);
      local_14 = uVar3;
      vec::vec((vec *)&f,0.0,0.0,0.0);
      bVar1 = addflag(this,uVar3,(vec *)&f,0,0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return;
      }
      pfVar4 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_14);
      spawnflag(this,local_14);
      uVar3 = pfVar4->version + 1;
      pfVar4->version = uVar3;
      sendf(-1,1,"ri6",0x51,(ulong)local_14,(ulong)uVar3,pfVar4->spawnindex,0,0);
    }
  }
  return;
}

Assistant:

void setupholdspawns()
    {
        if(!m_hold || holdspawns.empty()) return;
        while(flags.length() < HOLDFLAGS)
        {
            int i = flags.length();
            if(!addflag(i, vec(0, 0, 0), 0, 0)) break;
            flag &f = flags[i];
            spawnflag(i);
            sendf(-1, 1, "ri6", N_RESETFLAG, i, ++f.version, f.spawnindex, 0, 0);
        }
    }